

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O3

bool FIX::header_order::compare(int x,int y)

{
  bool bVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  uVar2 = 1;
  bVar3 = 1;
  if (x == 8) {
    bVar1 = false;
    uVar4 = 1;
  }
  else {
    if (x == 0x23) {
      uVar4 = 3;
    }
    else {
      if (x != 9) {
        bVar3 = 0;
        bVar1 = true;
        uVar4 = 0;
        goto LAB_00112cfd;
      }
      uVar4 = 2;
    }
    bVar1 = false;
  }
LAB_00112cfd:
  if (y != 8) {
    if (y == 0x23) {
      uVar2 = 3;
    }
    else {
      if (y != 9) {
        return (bool)(x < y | bVar3);
      }
      uVar2 = 2;
    }
  }
  if (bVar1) {
    return false;
  }
  return uVar4 < uVar2;
}

Assistant:

static bool compare(const int x, const int y) {
    int orderedX = getOrderedPosition(x);
    int orderedY = getOrderedPosition(y);

    if (orderedX && orderedY) {
      return orderedX < orderedY;
    } else if (orderedX) {
      return true;
    } else if (orderedY) {
      return false;
    } else {
      return x < y;
    }
  }